

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlSkipBlankChars(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar xVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  int res;
  int iVar7;
  
  iVar7 = 0;
  do {
    pxVar4 = ctxt->input;
    pxVar5 = pxVar4->cur;
    pxVar6 = pxVar5;
    do {
      xVar3 = *pxVar6;
      if (xVar3 == ' ') {
LAB_0012fe1f:
        pxVar4->col = pxVar4->col + 1;
      }
      else {
        if (1 < (byte)(xVar3 - 9)) {
          if (xVar3 != '\r') {
            pxVar4->cur = pxVar6;
            if (((4 < iVar7) && ((pxVar4->flags & 0x40) == 0)) &&
               ((long)pxVar4->end - (long)pxVar5 < 0xfa)) {
              xmlParserGrow(ctxt);
            }
            return iVar7;
          }
          goto LAB_0012fe1f;
        }
        if (xVar3 != '\n') goto LAB_0012fe1f;
        pxVar4->line = pxVar4->line + 1;
        pxVar4->col = 1;
      }
      pxVar1 = pxVar6 + 1;
      if (iVar7 != 0x7fffffff) {
        iVar7 = iVar7 + 1;
      }
      pxVar5 = pxVar5 + 1;
      pxVar2 = pxVar6 + 1;
      pxVar6 = pxVar1;
    } while (*pxVar2 != '\0');
    pxVar4->cur = pxVar1;
    xmlParserGrow(ctxt);
  } while( true );
}

Assistant:

int
xmlSkipBlankChars(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur;
    int res = 0;

    cur = ctxt->input->cur;
    while (IS_BLANK_CH(*cur)) {
        if (*cur == '\n') {
            ctxt->input->line++; ctxt->input->col = 1;
        } else {
            ctxt->input->col++;
        }
        cur++;
        if (res < INT_MAX)
            res++;
        if (*cur == 0) {
            ctxt->input->cur = cur;
            xmlParserGrow(ctxt);
            cur = ctxt->input->cur;
        }
    }
    ctxt->input->cur = cur;

    if (res > 4)
        GROW;

    return(res);
}